

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O3

bool Imath_3_2::extractAndRemoveScalingAndShear<float>
               (Matrix33<float> *mat,Vec2<float> *scl,float *shr,bool exc)

{
  float *scl_00;
  undefined1 auVar1 [16];
  bool bVar2;
  bool bVar3;
  long lVar4;
  bool bVar5;
  long lVar6;
  Vec2<float> *row;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  Vec2<float> VVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  float local_5c;
  Vec2<float> local_58;
  Vec2<float> VStack_50;
  float local_44;
  float *local_40;
  Vec2<float> *local_38;
  
  local_58.x = *(float *)((long)(mat->x + 0) + 0);
  local_58.y = *(float *)((long)(mat->x + 0) + 4);
  VStack_50 = *(Vec2<float> *)(mat->x + 1);
  local_5c = 0.0;
  lVar4 = 0;
  bVar3 = true;
  do {
    bVar2 = bVar3;
    lVar6 = 0;
    bVar3 = true;
    fVar10 = local_5c;
    do {
      bVar5 = bVar3;
      local_5c = mat->x[lVar4][lVar6];
      if (local_5c <= -local_5c) {
        local_5c = -local_5c;
      }
      if (local_5c <= fVar10) {
        local_5c = fVar10;
      }
      lVar6 = 1;
      bVar3 = false;
      fVar10 = local_5c;
    } while (bVar5);
    lVar4 = 1;
    bVar3 = false;
  } while (bVar2);
  if ((local_5c != 0.0) || (NAN(local_5c))) {
    row = &local_58;
    bVar3 = true;
    local_40 = shr;
    local_38 = scl;
    do {
      bVar2 = bVar3;
      bVar3 = checkForZeroScaleInRow<float>(&local_5c,row,exc);
      if (!bVar3) {
        return false;
      }
      auVar7._8_8_ = 0;
      auVar7._0_4_ = row->x;
      auVar7._4_4_ = row->y;
      auVar12._4_4_ = local_5c;
      auVar12._0_4_ = local_5c;
      auVar12._8_8_ = 0;
      auVar7 = divps(auVar7,auVar12);
      *row = auVar7._0_8_;
      scl = local_38;
      shr = local_40;
      row = &VStack_50;
      bVar3 = false;
    } while (bVar2);
  }
  fVar10 = local_58.x * local_58.x + local_58.y * local_58.y;
  if (fVar10 < 2.3509887e-38) {
    extractAndRemoveScalingAndShear<float>();
    fVar10 = local_44;
  }
  else {
    fVar10 = SQRT(fVar10);
  }
  scl->x = fVar10;
  bVar3 = checkForZeroScaleInRow<float>(&scl->x,&local_58,exc);
  if (bVar3) {
    fVar10 = scl->x;
    auVar8._4_4_ = fVar10;
    auVar8._0_4_ = fVar10;
    auVar8._8_4_ = fVar10;
    auVar8._12_4_ = fVar10;
    auVar13._8_8_ = 0;
    auVar13._0_4_ = local_58.x;
    auVar13._4_4_ = local_58.y;
    auVar7 = divps(auVar13,auVar8);
    fVar10 = VStack_50.y;
    fVar14 = auVar7._0_4_ * VStack_50.x + auVar7._4_4_ * fVar10;
    *shr = fVar14;
    VStack_50.x = VStack_50.x - fVar14 * auVar7._0_4_;
    VStack_50.y = fVar10 - fVar14 * auVar7._4_4_;
    local_58 = auVar7._0_8_;
    fVar10 = VStack_50.x * VStack_50.x + VStack_50.y * VStack_50.y;
    if (fVar10 < 2.3509887e-38) {
      extractAndRemoveScalingAndShear<float>();
    }
    else {
      local_44 = SQRT(fVar10);
    }
    scl_00 = &scl->y;
    scl->y = local_44;
    bVar3 = checkForZeroScaleInRow<float>(scl_00,&VStack_50,exc);
    if (bVar3) {
      fVar10 = *scl_00;
      auVar9._8_8_ = 0;
      auVar9._0_4_ = VStack_50.x;
      auVar9._4_4_ = VStack_50.y;
      auVar1._4_4_ = fVar10;
      auVar1._0_4_ = fVar10;
      auVar1._8_4_ = fVar10;
      auVar1._12_4_ = fVar10;
      auVar7 = divps(auVar9,auVar1);
      VStack_50 = auVar7._0_8_;
      *shr = *shr / fVar10;
      if (auVar7._4_4_ * local_58.x - local_58.y * auVar7._0_4_ < 0.0) {
        VStack_50 = (Vec2<float>)((ulong)VStack_50 ^ 0x8000000080000000);
        *scl_00 = -*scl_00;
        *shr = -*shr;
      }
      *(float *)((long)(mat->x + 0) + 0) = local_58.x;
      *(float *)((long)(mat->x + 0) + 4) = local_58.y;
      *(Vec2<float> *)(mat->x + 1) = VStack_50;
      VVar11.x = local_5c * (*scl).x;
      VVar11.y = local_5c * (*scl).y;
      *scl = VVar11;
      return true;
    }
  }
  return false;
}

Assistant:

bool
extractAndRemoveScalingAndShear (
    Matrix33<T>& mat, Vec2<T>& scl, T& shr, bool exc)
{
    Vec2<T> row[2];

    row[0] = Vec2<T> (mat[0][0], mat[0][1]);
    row[1] = Vec2<T> (mat[1][0], mat[1][1]);

    T maxVal = 0;
    for (int i = 0; i < 2; i++)
        for (int j = 0; j < 2; j++)
            if (IMATH_INTERNAL_NAMESPACE::abs (mat[i][j]) > maxVal)
                maxVal = IMATH_INTERNAL_NAMESPACE::abs (mat[i][j]);

    //
    // We normalize the 2x2 matrix here.
    // It was noticed that this can improve numerical stability significantly,
    // especially when many of the upper 2x2 matrix's coefficients are very
    // close to zero; we correct for this step at the end by multiplying the
    // scaling factors by maxVal at the end (shear and rotation are not
    // affected by the normalization).

    if (maxVal != 0)
    {
        for (int i = 0; i < 2; i++)
            if (!checkForZeroScaleInRow (maxVal, row[i], exc))
                return false;
            else
                row[i] /= maxVal;
    }

    // Compute X scale factor.
    scl.x = row[0].length ();
    if (!checkForZeroScaleInRow (scl.x, row[0], exc)) return false;

    // Normalize first row.
    row[0] /= scl.x;

    // An XY shear factor will shear the X coord. as the Y coord. changes.
    // There are 2 combinations (XY, YX), although we only extract the XY
    // shear factor because we can effect the an YX shear factor by
    // shearing in XY combined with rotations and scales.
    //
    // shear matrix <   1,  YX,  0,
    //                 XY,   1,  0,
    //                  0,   0,  1 >

    // Compute XY shear factor and make 2nd row orthogonal to 1st.
    shr = row[0].dot (row[1]);
    row[1] -= shr * row[0];

    // Now, compute Y scale.
    scl.y = row[1].length ();
    if (!checkForZeroScaleInRow (scl.y, row[1], exc)) return false;

    // Normalize 2nd row and correct the XY shear factor for Y scaling.
    row[1] /= scl.y;
    shr /= scl.y;

    // At this point, the upper 2x2 matrix in mat is orthonormal.
    // Check for a coordinate system flip. If the determinant
    // is -1, then flip the rotation matrix and adjust the scale(Y)
    // and shear(XY) factors to compensate.
    if (row[0].x * row[1].y - row[0].y * row[1].x < 0)
    {
        row[1].x *= -1;
        row[1].y *= -1;
        scl.y *= -1;
        shr *= -1;
    }

    // Copy over the orthonormal rows into the returned matrix.
    // The upper 2x2 matrix in mat is now a rotation matrix.
    for (int i = 0; i < 2; i++)
    {
        mat[i][0] = row[i].x;
        mat[i][1] = row[i].y;
    }

    scl *= maxVal;

    return true;
}